

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  GetterHeatmap<unsigned_char> *pGVar12;
  TransformerLinLog *pTVar13;
  ImPlotPlot *pIVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImVec2 IVar17;
  double dVar18;
  ImVec2 IVar19;
  ImPlotContext *pIVar20;
  ImPlotContext *pIVar21;
  bool bVar22;
  bool bVar23;
  ImDrawIdx IVar24;
  ImU32 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  ImVec2 IVar31;
  double dVar32;
  ImVec2 IVar33;
  float fVar34;
  double dVar35;
  double dVar36;
  
  pGVar12 = this->Getter;
  iVar9 = pGVar12->Cols;
  dVar35 = (pGVar12->HalfSize).x;
  dVar36 = pGVar12->Width;
  dVar2 = pGVar12->XRef;
  dVar3 = (pGVar12->HalfSize).y;
  dVar30 = ((double)(prim / iVar9) * pGVar12->Height + dVar3) * pGVar12->YDir + pGVar12->YRef;
  fVar26 = (float)(((double)pGVar12->Values[prim] - pGVar12->ScaleMin) /
                  (pGVar12->ScaleMax - pGVar12->ScaleMin));
  fVar34 = 1.0;
  if (fVar26 <= 1.0) {
    fVar34 = fVar26;
  }
  IVar25 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar34));
  pIVar20 = GImPlot;
  pTVar13 = this->Transformer;
  dVar18 = log10((dVar30 - dVar3) / GImPlot->CurrentPlot->YAxis[pTVar13->YAxis].Range.Min);
  pIVar21 = GImPlot;
  iVar10 = pTVar13->YAxis;
  dVar32 = pIVar20->LogDenY[iVar10];
  pIVar14 = pIVar20->CurrentPlot;
  dVar4 = pIVar20->My[iVar10];
  dVar5 = pIVar14->YAxis[iVar10].Range.Min;
  dVar6 = pIVar14->YAxis[iVar10].Range.Max;
  pTVar13 = this->Transformer;
  fVar34 = pIVar20->PixelRange[iVar10].Min.x;
  fVar26 = pIVar20->PixelRange[iVar10].Min.y;
  dVar7 = (pIVar14->XAxis).Range.Min;
  dVar8 = pIVar20->Mx;
  dVar3 = log10((dVar30 + dVar3) / GImPlot->CurrentPlot->YAxis[pTVar13->YAxis].Range.Min);
  if (IVar25 < 0x1000000) {
    bVar23 = false;
  }
  else {
    dVar2 = (double)(prim % iVar9) * dVar36 + dVar2 + dVar35;
    iVar9 = pTVar13->YAxis;
    pIVar14 = pIVar21->CurrentPlot;
    dVar36 = pIVar14->YAxis[iVar9].Range.Min;
    dVar30 = pIVar21->Mx * ((dVar2 + dVar35) - (pIVar14->XAxis).Range.Min) +
             (double)pIVar21->PixelRange[iVar9].Min.x;
    dVar32 = dVar4 * (((double)(float)(dVar18 / dVar32) * (dVar6 - dVar5) + dVar5) - dVar5) +
             (double)fVar26;
    fVar26 = (float)dVar30;
    fVar27 = (float)dVar32;
    dVar35 = dVar8 * ((dVar2 - dVar35) - dVar7) + (double)fVar34;
    dVar36 = pIVar21->My[iVar9] *
             (((double)(float)(dVar3 / pIVar21->LogDenY[iVar9]) *
               (pIVar14->YAxis[iVar9].Range.Max - dVar36) + dVar36) - dVar36) +
             (double)pIVar21->PixelRange[iVar9].Min.y;
    fVar28 = (float)dVar35;
    fVar29 = (float)dVar36;
    fVar34 = fVar27;
    if (fVar29 <= fVar27) {
      fVar34 = fVar29;
    }
    bVar22 = false;
    bVar23 = false;
    if ((fVar34 < (cull_rect->Max).y) &&
       (fVar34 = (float)(~-(uint)(fVar29 <= fVar27) & (uint)fVar29 |
                        (uint)fVar27 & -(uint)(fVar29 <= fVar27)), pfVar1 = &(cull_rect->Min).y,
       bVar23 = bVar22, *pfVar1 <= fVar34 && fVar34 != *pfVar1)) {
      fVar34 = fVar28;
      if (fVar26 <= fVar28) {
        fVar34 = fVar26;
      }
      if ((fVar34 < (cull_rect->Max).x) &&
         (fVar34 = (float)(~-(uint)(fVar26 <= fVar28) & (uint)fVar26 |
                          -(uint)(fVar26 <= fVar28) & (uint)fVar28),
         (cull_rect->Min).x <= fVar34 && fVar34 != (cull_rect->Min).x)) {
        IVar33.x = (float)dVar35;
        IVar33.y = (float)dVar32;
        IVar31.x = (float)dVar30;
        IVar31.y = (float)dVar36;
        DrawList->_VtxWritePtr->pos = IVar33;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar15 = DrawList->_VtxWritePtr;
        pIVar15->col = IVar25;
        IVar19.y = fVar29;
        IVar19.x = fVar28;
        pIVar15[1].pos = IVar19;
        pIVar15[1].uv = *uv;
        pIVar15 = DrawList->_VtxWritePtr;
        pIVar15[1].col = IVar25;
        pIVar15[2].pos = IVar31;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar15 = DrawList->_VtxWritePtr;
        pIVar15[2].col = IVar25;
        IVar17.y = fVar27;
        IVar17.x = fVar26;
        pIVar15[3].pos = IVar17;
        pIVar15[3].uv = *uv;
        pIVar15 = DrawList->_VtxWritePtr;
        pIVar15[3].col = IVar25;
        DrawList->_VtxWritePtr = pIVar15 + 4;
        uVar11 = DrawList->_VtxCurrentIdx;
        pIVar16 = DrawList->_IdxWritePtr;
        IVar24 = (ImDrawIdx)uVar11;
        *pIVar16 = IVar24;
        pIVar16[1] = IVar24 + 1;
        pIVar16[2] = IVar24 + 3;
        pIVar16[3] = IVar24 + 1;
        pIVar16[4] = IVar24 + 2;
        pIVar16[5] = IVar24 + 3;
        DrawList->_IdxWritePtr = pIVar16 + 6;
        DrawList->_VtxCurrentIdx = uVar11 + 4;
        bVar23 = true;
      }
    }
  }
  return bVar23;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }